

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

int bam_readrec(BGZF *fp,void *ignored,void *bv,int *tid,int *beg,int *end)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = bam_read1(fp,(bam1_t *)bv);
  if (-1 < iVar3) {
    *tid = *bv;
    iVar1 = *(int *)((long)bv + 4);
    *beg = iVar1;
    uVar2 = *(ulong *)((long)bv + 8);
    if (uVar2 >> 0x30 == 0) {
      iVar4 = 1;
    }
    else {
      iVar4 = bam_cigar2rlen((uint)(ushort)(uVar2 >> 0x30),
                             (uint32_t *)((uVar2 >> 0x18 & 0xff) + *(long *)((long)bv + 0x28)));
    }
    *end = iVar4 + iVar1;
  }
  return iVar3;
}

Assistant:

static int bam_readrec(BGZF *fp, void *ignored, void *bv, int *tid, int *beg, int *end)
{
    bam1_t *b = bv;
    int ret;
    if ((ret = bam_read1(fp, b)) >= 0) {
        *tid = b->core.tid; *beg = b->core.pos;
        *end = b->core.pos + (b->core.n_cigar? bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b)) : 1);
    }
    return ret;
}